

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.cpp
# Opt level: O0

void cut(ISegment *seg,char *filePath)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  ulong uVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  char *pcVar5;
  char *in_RSI;
  long *in_RDI;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  ifstream ifile;
  ostream *in_stack_fffffffffffffcc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffce0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_310;
  string *connector;
  undefined7 in_stack_fffffffffffffd00;
  allocator local_2d9;
  string local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [48];
  string local_250 [32];
  string local_230 [24];
  
  std::ifstream::ifstream(&stack0xfffffffffffffde8,in_RSI,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12861e);
  std::__cxx11::string::string(local_250);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stack0xfffffffffffffde8,local_250);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      begin._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)&std::cout,local_250);
      std::ostream::operator<<((ostream *)begin._M_current,std::endl<char,std::char_traits<char>>);
      connector = local_230;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x1286c3);
      bVar2 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_250,connector);
      if ((bVar2 & 1) == 0) {
        pcVar5 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/segment.cpp"
                         ,0x2f);
        if (pcVar5 == (char *)0x0) {
          local_310 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x145060;
        }
        else {
          local_310 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/segment.cpp"
                                 ,0x2f);
          local_310 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)local_310 + 1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_280,"seg cut failed.",&local_281);
        Limonp::Logger::LoggingF(3,(char *)local_310,0x1b,(string *)local_280);
        std::__cxx11::string::~string(local_280);
        std::allocator<char>::~allocator((allocator<char> *)&local_281);
        in_stack_fffffffffffffce0 = local_310;
      }
      else {
        local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffcc8);
        local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffcc8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,"/",&local_2d9);
        end._M_current._7_1_ = bVar2;
        end._M_current._0_7_ = in_stack_fffffffffffffd00;
        Limonp::
        join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (begin,end,connector);
        in_stack_fffffffffffffcc8 = std::operator<<((ostream *)&std::cout,local_2a8);
        std::ostream::operator<<(in_stack_fffffffffffffcc8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2a8);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      }
    }
  }
  std::__cxx11::string::~string(local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffce0);
  std::ifstream::~ifstream(&stack0xfffffffffffffde8);
  return;
}

Assistant:

void cut(const ISegment * seg, const char * const filePath)
{
    ifstream ifile(filePath);
    vector<string> res;
    string line;
    while(getline(ifile, line))
    {
        if(!line.empty())
        {
            cout << line << endl;
            res.clear();
            if(!seg->cut(line, res))
            {
                LogError("seg cut failed.");
            }
            else
            {
                print(join(res.begin(), res.end(), "/"));
            }
        }
    }
}